

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSizeLong(CodeGeneratorResponse *this)

{
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this_00;
  long lVar1;
  anon_union_56_1_493b367e_for_CodeGeneratorResponse_11 aVar2;
  void **ppvVar3;
  const_iterator cVar4;
  size_t sVar5;
  ulong uVar6;
  CachedSize *pCVar7;
  
  pCVar7 = (CachedSize *)(long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.file_;
  ppvVar3 = protobuf::internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase)
  ;
  cVar4 = RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::end(this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = protobuf::internal::WireFormatLite::
            MessageSize<google::protobuf::compiler::CodeGeneratorResponse_File>
                      ((CodeGeneratorResponse_File *)*ppvVar3);
    pCVar7 = (CachedSize *)((long)&pCVar7->atom_ + sVar5);
  }
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0xf) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      sVar5 = protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.error_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                         ));
      pCVar7 = (CachedSize *)((long)&pCVar7->atom_ + sVar5 + 1);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      uVar6 = (this->field_0)._impl_.supported_features_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      pCVar7 = (CachedSize *)((long)&pCVar7->atom_ + (ulong)((int)lVar1 * 9 + 0x89U >> 6));
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      uVar6 = (long)(this->field_0)._impl_.minimum_edition_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      pCVar7 = (CachedSize *)((long)&pCVar7->atom_ + (ulong)((int)lVar1 * 9 + 0x89U >> 6));
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      uVar6 = (long)(this->field_0)._impl_.maximum_edition_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      pCVar7 = (CachedSize *)((long)&pCVar7->atom_ + (ulong)((int)lVar1 * 9 + 0x89U >> 6));
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize((ulong)this,pCVar7);
  return sVar5;
}

Assistant:

::size_t CodeGeneratorResponse::ByteSizeLong() const {
          const CodeGeneratorResponse& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse)
          ::size_t total_size = 0;

          ::uint32_t cached_has_bits = 0;
          // Prevent compiler warnings about cached_has_bits being unused
          (void)cached_has_bits;

          ::_pbi::Prefetch5LinesFrom7Lines(&this_);
           {
            // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
            {
              total_size += 1UL * this_._internal_file_size();
              for (const auto& msg : this_._internal_file()) {
                total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
              }
            }
          }
          cached_has_bits = this_._impl_._has_bits_[0];
          if (cached_has_bits & 0x0000000fu) {
            // optional string error = 1;
            if (cached_has_bits & 0x00000001u) {
              total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                              this_._internal_error());
            }
            // optional uint64 supported_features = 2;
            if (cached_has_bits & 0x00000002u) {
              total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
                  this_._internal_supported_features());
            }
            // optional int32 minimum_edition = 3;
            if (cached_has_bits & 0x00000004u) {
              total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
                  this_._internal_minimum_edition());
            }
            // optional int32 maximum_edition = 4;
            if (cached_has_bits & 0x00000008u) {
              total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
                  this_._internal_maximum_edition());
            }
          }
          return this_.MaybeComputeUnknownFieldsSize(total_size,
                                                     &this_._impl_._cached_size_);
        }